

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_magick
          (CImg<unsigned_char> *this,char *filename,uint bytes_per_pixel)

{
  bool bVar1;
  CImgArgumentException *this_00;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar2;
  char *pcVar3;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)
              __cxa_allocate_exception(0x4008,0,CONCAT44(in_register_00000014,bytes_per_pixel));
    pcVar3 = "non-";
    if (this->_is_shared != false) {
      pcVar3 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar3,"unsigned char");
    ppuVar2 = &CImgArgumentException::typeinfo;
  }
  else {
    bVar1 = is_empty(this);
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar3 = "non-";
    if (this->_is_shared != false) {
      pcVar3 = "";
    }
    if (bVar1) {
      CImgInstanceException::CImgInstanceException
                ((CImgInstanceException *)this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Empty instance, for file \'%s\'."
                );
      ppuVar2 = &CImgInstanceException::typeinfo;
    }
    else {
      CImgIOException::CImgIOException
                ((CImgIOException *)this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Unable to save file \'%s\' unless libMagick++ is enabled."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar3,"unsigned char",filename);
      ppuVar2 = &CImgIOException::typeinfo;
    }
  }
  __cxa_throw(this_00,ppuVar2,std::exception::~exception);
}

Assistant:

const CImg<T>& save_magick(const char *const filename, const unsigned int bytes_per_pixel=0) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_magick() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_magick() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);
#ifdef cimg_use_magick
      double stmin, stmax = (double)max_min(stmin);
      if (_depth>1)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is volumetric, only the first slice will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (_spectrum>3)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is multispectral, only the three first channels will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (stmin<0 || (bytes_per_pixel==1 && stmax>=256) || stmax>=65536)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance has pixel values in [%g,%g], probable type overflow in file '%s'.",
                   cimg_instance,
                   filename,stmin,stmax);

      Magick::Image image(Magick::Geometry(_width,_height),"black");
      image.type(Magick::TrueColorType);
      image.depth(bytes_per_pixel?(8*bytes_per_pixel):(stmax>=256?16:8));
      const T
        *ptr_r = data(0,0,0,0),
        *ptr_g = _spectrum>1?data(0,0,0,1):0,
        *ptr_b = _spectrum>2?data(0,0,0,2):0;
      Magick::PixelPacket *pixels = image.getPixels(0,0,_width,_height);
      switch (_spectrum) {
      case 1 : // Scalar images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = pixels->green = pixels->blue = (Magick::Quantum)*(ptr_r++);
          ++pixels;
        }
        break;
      case 2 : // RG images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = 0; ++pixels;
        }
        break;
      default : // RGB images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = (Magick::Quantum)*(ptr_b++);
          ++pixels;
        }
      }
      image.syncPixels();
      image.write(filename);
#else
      cimg::unused(bytes_per_pixel);
      throw CImgIOException(_cimg_instance
                            "save_magick() : Unable to save file '%s' unless libMagick++ is enabled.",
                            cimg_instance,
                            filename);
#endif
      return *this;
    }